

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_reader.cc
# Opt level: O3

void __thiscall leveldb::log::Reader::ReportCorruption(Reader *this,uint64_t bytes,char *reason)

{
  Reporter *pRVar1;
  Status local_40;
  Slice local_38;
  Slice local_28;
  
  local_28.data_ = reason;
  local_28.size_ = strlen(reason);
  local_38.data_ = "";
  local_38.size_ = 0;
  Status::Status(&local_40,kCorruption,&local_28,&local_38);
  pRVar1 = this->reporter_;
  if ((pRVar1 != (Reporter *)0x0) &&
     (this->initial_offset_ <= this->end_of_buffer_offset_ - ((this->buffer_).size_ + bytes))) {
    (*pRVar1->_vptr_Reporter[2])(pRVar1,bytes,&local_40);
  }
  if (local_40.state_ != (char *)0x0) {
    operator_delete__(local_40.state_);
  }
  return;
}

Assistant:

void Reader::ReportCorruption(uint64_t bytes, const char* reason) {
  ReportDrop(bytes, Status::Corruption(reason));
}